

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getMemory
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,Name *mem)

{
  bool bVar1;
  ulong pos_00;
  reference this_00;
  pointer u;
  allocator<char> local_69;
  string local_68;
  Err local_48;
  Name *local_28;
  Name *mem_local;
  ParseDefsCtx *pPStack_18;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  local_28 = mem;
  mem_local._4_4_ = pos;
  pPStack_18 = this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  if (mem == (Name *)0x0) {
    bVar1 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::empty(&this->wasm->memories);
    if (bVar1) {
      pos_00 = (ulong)mem_local._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"memory required, but there is no memory",&local_69);
      Lexer::err(&local_48,&this->in,pos_00,&local_68);
      Result<wasm::Name>::Result(__return_storage_ptr__,&local_48);
      wasm::Err::~Err(&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    else {
      this_00 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[](&this->wasm->memories,0);
      u = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00);
      Result<wasm::Name>::Result<wasm::Name&>(__return_storage_ptr__,(Name *)u);
    }
  }
  else {
    Result<wasm::Name>::Result<wasm::Name&>(__return_storage_ptr__,mem);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getMemory(Index pos, Name* mem) {
    if (mem) {
      return *mem;
    }
    if (wasm.memories.empty()) {
      return in.err(pos, "memory required, but there is no memory");
    }
    return wasm.memories[0]->name;
  }